

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void __thiscall RefTable::Resize(RefTable *this,SQUnsignedInteger size)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  RefNode **p;
  SQUnsignedInteger SVar3;
  SQTable *pSVar4;
  SQHash SVar5;
  RefNode *pRVar6;
  SQUnsignedInteger SVar7;
  RefNode *obj;
  
  p = this->_buckets;
  SVar3 = this->_numofslots;
  obj = this->_nodes;
  AllocNodes(this,size);
  SVar7 = SVar3;
  do {
    if (SVar7 == 0) {
      sq_vm_free(p,SVar3 * 0x28);
      return;
    }
    SVar2 = (obj->obj).super_SQObject._type;
    if ((int)SVar2 < 0x5000002) {
      if (SVar2 != OT_NULL) {
        if (SVar2 == OT_BOOL) goto LAB_0011eff1;
LAB_0011efff:
        SVar5 = (obj->obj).super_SQObject._unVal.nInteger >> 3;
        goto LAB_0011f007;
      }
    }
    else {
      if (SVar2 == OT_INTEGER) {
LAB_0011eff1:
        SVar5 = (obj->obj).super_SQObject._unVal.nInteger;
      }
      else if (SVar2 == OT_FLOAT) {
        SVar5 = (SQHash)(obj->obj).super_SQObject._unVal.fFloat;
      }
      else {
        if (SVar2 != OT_STRING) goto LAB_0011efff;
        SVar5 = ((obj->obj).super_SQObject._unVal.pString)->_hash;
      }
LAB_0011f007:
      pRVar6 = Add(this,this->_numofslots - 1 & SVar5,(SQObject *)obj);
      pRVar6->refs = obj->refs;
      pSVar4 = (obj->obj).super_SQObject._unVal.pTable;
      SVar2 = (obj->obj).super_SQObject._type;
      (obj->obj).super_SQObject._type = OT_NULL;
      (obj->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
    }
    obj = obj + 1;
    SVar7 = SVar7 - 1;
  } while( true );
}

Assistant:

void RefTable::Resize(SQUnsignedInteger size)
{
    RefNode **oldbucks = _buckets;
    RefNode *t = _nodes;
    SQUnsignedInteger oldnumofslots = _numofslots;
    AllocNodes(size);
    //rehash
    SQUnsignedInteger nfound = 0;
    for(SQUnsignedInteger n = 0; n < oldnumofslots; n++) {
        if(sq_type(t->obj) != OT_NULL) {
            //add back;
            assert(t->refs != 0);
            RefNode *nn = Add(::HashObj(t->obj)&(_numofslots-1),t->obj);
            nn->refs = t->refs;
            t->obj.Null();
            nfound++;
        }
        t++;
    }
    assert(nfound == oldnumofslots);
    SQ_FREE(oldbucks,(oldnumofslots * sizeof(RefNode *)) + (oldnumofslots * sizeof(RefNode)));
}